

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3StrAccumEnlarge(StrAccum *p,int N)

{
  u32 uVar1;
  sqlite3 *psVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (p->accError != '\0') {
    return 0;
  }
  uVar5 = (ulong)p->mxAlloc;
  if (uVar5 == 0) {
    uVar1 = p->nAlloc;
    p->accError = '\x02';
    p->nAlloc = 0;
    return ~p->nChar + uVar1;
  }
  if ((p->printfFlags & 4) == 0) {
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar6 = p->zText;
  }
  uVar7 = (long)N + (ulong)p->nChar * 2 + 1;
  uVar8 = (long)N + (ulong)p->nChar + 1;
  if ((long)uVar7 <= (long)uVar5) {
    uVar8 = uVar7;
  }
  if ((long)uVar5 < (long)uVar8) {
    sqlite3StrAccumReset(p);
    p->accError = '\x02';
    goto LAB_001f8ddd;
  }
  p->nAlloc = (u32)uVar8;
  if (p->db == (sqlite3 *)0x0) {
    iVar4 = sqlite3_initialize();
    if (iVar4 == 0) {
      pcVar6 = (char *)sqlite3Realloc(pcVar6,uVar8 & 0xffffffff);
      goto LAB_001f8d6b;
    }
  }
  else {
    pcVar6 = (char *)sqlite3DbRealloc(p->db,pcVar6,uVar8 & 0xffffffff);
LAB_001f8d6b:
    if (pcVar6 != (char *)0x0) {
      if (((p->printfFlags & 4) == 0) && ((ulong)p->nChar != 0)) {
        memcpy(pcVar6,p->zText,(ulong)p->nChar);
      }
      p->zText = pcVar6;
      psVar2 = p->db;
      if (((psVar2 == (sqlite3 *)0x0) || (pcVar6 < (psVar2->lookaside).pStart)) ||
         ((psVar2->lookaside).pEnd <= pcVar6)) {
        uVar3 = (*sqlite3Config.m.xSize)(pcVar6);
      }
      else {
        uVar3 = (uint)(psVar2->lookaside).sz;
      }
      p->nAlloc = uVar3;
      p->printfFlags = p->printfFlags | 4;
      return N;
    }
  }
  sqlite3StrAccumReset(p);
  p->accError = '\x01';
LAB_001f8ddd:
  p->nAlloc = 0;
  return 0;
}

Assistant:

static int sqlite3StrAccumEnlarge(StrAccum *p, int N){
  char *zNew;
  assert( p->nChar+(i64)N >= p->nAlloc ); /* Only called if really needed */
  if( p->accError ){
    testcase(p->accError==STRACCUM_TOOBIG);
    testcase(p->accError==STRACCUM_NOMEM);
    return 0;
  }
  if( p->mxAlloc==0 ){
    N = p->nAlloc - p->nChar - 1;
    setStrAccumError(p, STRACCUM_TOOBIG);
    return N;
  }else{
    char *zOld = isMalloced(p) ? p->zText : 0;
    i64 szNew = p->nChar;
    assert( (p->zText==0 || p->zText==p->zBase)==!isMalloced(p) );
    szNew += N + 1;
    if( szNew+p->nChar<=p->mxAlloc ){
      /* Force exponential buffer size growth as long as it does not overflow,
      ** to avoid having to call this routine too often */
      szNew += p->nChar;
    }
    if( szNew > p->mxAlloc ){
      sqlite3StrAccumReset(p);
      setStrAccumError(p, STRACCUM_TOOBIG);
      return 0;
    }else{
      p->nAlloc = (int)szNew;
    }
    if( p->db ){
      zNew = sqlite3DbRealloc(p->db, zOld, p->nAlloc);
    }else{
      zNew = sqlite3_realloc64(zOld, p->nAlloc);
    }
    if( zNew ){
      assert( p->zText!=0 || p->nChar==0 );
      if( !isMalloced(p) && p->nChar>0 ) memcpy(zNew, p->zText, p->nChar);
      p->zText = zNew;
      p->nAlloc = sqlite3DbMallocSize(p->db, zNew);
      p->printfFlags |= SQLITE_PRINTF_MALLOCED;
    }else{
      sqlite3StrAccumReset(p);
      setStrAccumError(p, STRACCUM_NOMEM);
      return 0;
    }
  }
  return N;
}